

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nls.c
# Opt level: O1

void fdjac2(custom_funcmult *funcmult,double *x,int M,int N,double *fvec,double *fjac,int ldfjac,
           double epsfcn,double eps)

{
  double dVar1;
  double dVar2;
  double *__ptr;
  double *pdVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  double *local_48;
  
  dVar6 = pmax(epsfcn,eps);
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
  }
  else {
    dVar6 = SQRT(dVar6);
  }
  __ptr = (double *)malloc((long)M << 3);
  if (0 < N) {
    uVar4 = 0;
    local_48 = fjac;
    do {
      dVar1 = x[uVar4];
      uVar5 = -(ulong)(ABS(dVar1) * dVar6 == 0.0);
      dVar2 = (double)(uVar5 & (ulong)dVar6 | ~uVar5 & (ulong)(ABS(dVar1) * dVar6));
      x[uVar4] = dVar1 + dVar2;
      (*funcmult->funcmult)(x,M,N,__ptr,funcmult->params);
      x[uVar4] = dVar1;
      if (0 < M) {
        uVar5 = 0;
        pdVar3 = local_48;
        do {
          *pdVar3 = (__ptr[uVar5] - fvec[uVar5]) / dVar2;
          uVar5 = uVar5 + 1;
          pdVar3 = pdVar3 + (uint)N;
        } while ((uint)M != uVar5);
      }
      uVar4 = uVar4 + 1;
      local_48 = local_48 + 1;
    } while (uVar4 != (uint)N);
  }
  free(__ptr);
  return;
}

Assistant:

void fdjac2(custom_funcmult *funcmult, double *x, int M, int N, double *fvec, double *fjac, int ldfjac,
		double epsfcn,double eps) {
	int i,j;
	double epsmch,h,temp,zero;
	double *wa;

	zero = 0.0;
	epsmch = eps;
	eps = sqrt(pmax(epsfcn,epsmch));

	wa = (double*) malloc(sizeof(double) *M);

	for(j = 0; j < N;++j) {
        temp = x[j];
        h = eps*fabs(temp);
        if (h == zero) {
        	h = eps;
        }
        x[j] = temp + h;
        FUNCMULT_EVAL(funcmult,x,M,N,wa);
        x[j] = temp;
        for(i = 0; i < M;++i) {
        	fjac[i*N+j] = (wa[i] - fvec[i])/h;
        }
	}

	free(wa);

}